

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

RefNull * __thiscall wasm::Builder::makeRefNull(Builder *this,HeapType type)

{
  uint uVar1;
  Type TVar2;
  HeapType HVar3;
  HeapType type_local;
  
  TVar2.id = (uintptr_t)MixedArena::alloc<wasm::RefNull>(&this->wasm->allocator);
  uVar1 = wasm::HeapType::getBottom();
  HVar3.id._4_4_ = 0;
  HVar3.id._0_4_ = uVar1;
  wasm::Type::Type((Type *)&type_local,HVar3,Nullable);
  wasm::RefNull::finalize(TVar2);
  return (RefNull *)TVar2.id;
}

Assistant:

RefNull* makeRefNull(HeapType type) {
    auto* ret = wasm.allocator.alloc<RefNull>();
    ret->finalize(Type(type.getBottom(), Nullable));
    return ret;
  }